

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O3

Fraction operator*(Fraction *a,Fraction *b)

{
  uint __n;
  uint __m;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _Ct __n2;
  
  uVar3 = b->numerator_ * (*a).numerator_;
  uVar2 = (*a).denominator_ * b->denominator_;
  __n = -uVar2;
  if (0 < (int)uVar2) {
    __n = uVar2;
  }
  __m = uVar3;
  if ((int)uVar3 < 1) {
    __m = -uVar3;
  }
  uVar1 = -uVar3;
  if (-1 < (int)uVar2) {
    uVar1 = uVar3;
  }
  uVar2 = std::__detail::__gcd<unsigned_int>(__m,__n);
  return (Fraction)
         ((long)(int)__n / (long)(int)uVar2 << 0x20 |
         (long)(int)uVar1 / (long)(int)uVar2 & 0xffffffffU);
}

Assistant:

Fraction operator*(const Fraction& a, const Fraction& b) {
  Fraction current_frac = a;
  current_frac.numerator_ *= b.numerator_;
  current_frac.denominator_ *= b.denominator_;
  current_frac.Normalization();
  return current_frac;
}